

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

lys_module * lys_parse_path(ly_ctx *ctx,char *path,LYS_INFORMAT format)

{
  uint8_t uVar1;
  int iVar2;
  lys_module *plVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  size_t __n;
  char *pcVar7;
  LY_ERR *pLVar8;
  int *piVar9;
  char *pcVar10;
  
  if (ctx == (ly_ctx *)0x0 || path == (char *)0x0) {
    pLVar8 = ly_errno_location();
    *pLVar8 = LY_EINVAL;
    ly_log(LY_LLERR,"%s: Invalid parameter.","lys_parse_path");
    return (lys_module *)0x0;
  }
  iVar2 = open(path,0);
  if (iVar2 == -1) {
    pLVar8 = ly_errno_location();
    *pLVar8 = LY_ESYS;
    piVar9 = __errno_location();
    pcVar10 = strerror(*piVar9);
    ly_log(LY_LLERR,"Opening file \"%s\" failed (%s).",path,pcVar10);
    return (lys_module *)0x0;
  }
  plVar3 = lys_parse_fd(ctx,iVar2,format);
  close(iVar2);
  if (plVar3 == (lys_module *)0x0) {
    return (lys_module *)0x0;
  }
  pcVar4 = strrchr(path,0x2f);
  pcVar10 = pcVar4 + 1;
  if (pcVar4 == (char *)0x0) {
    pcVar10 = path;
  }
  pcVar5 = strchr(pcVar10,0x40);
  pcVar6 = strrchr(pcVar10,0x2e);
  pcVar4 = plVar3->name;
  __n = strlen(pcVar4);
  iVar2 = strncmp(pcVar10,pcVar4,__n);
  if (iVar2 == 0) {
    pcVar7 = pcVar5;
    if (pcVar5 == (char *)0x0) {
      pcVar7 = pcVar6;
    }
    if (pcVar10 + __n == pcVar7) goto LAB_00156627;
  }
  if ('\0' < ly_log_level) {
    ly_log(LY_LLWRN,"File name \"%s\" does not match module name \"%s\".",pcVar10,pcVar4);
  }
LAB_00156627:
  if (((pcVar5 != (char *)0x0) &&
      (((uVar1 = plVar3->rev_size, uVar1 == '\0' || ((long)pcVar6 - (long)(pcVar5 + 1) != 10)) ||
       (iVar2 = strncmp(plVar3->rev->date,pcVar5 + 1,10), iVar2 != 0)))) && ('\0' < ly_log_level)) {
    if (uVar1 == '\0') {
      pcVar4 = "none";
    }
    else {
      pcVar4 = plVar3->rev->date;
    }
    ly_log(LY_LLWRN,"File name \"%s\" does not match module revision \"%s\".",pcVar10,pcVar4);
  }
  if (plVar3->filepath == (char *)0x0) {
    pcVar10 = lydict_insert(ctx,path,0);
    plVar3->filepath = pcVar10;
  }
  return plVar3;
}

Assistant:

lys_module *
lys_parse_path(struct ly_ctx *ctx, const char *path, LYS_INFORMAT format)
{
    int fd;
    const struct lys_module *ret;
    const char *rev, *dot, *filename;
    size_t len;

    if (!ctx || !path) {
        LOGERR(LY_EINVAL, "%s: Invalid parameter.", __func__);
        return NULL;
    }

    fd = open(path, O_RDONLY);
    if (fd == -1) {
        LOGERR(LY_ESYS, "Opening file \"%s\" failed (%s).", path, strerror(errno));
        return NULL;
    }

    ret = lys_parse_fd(ctx, fd, format);
    close(fd);

    if (!ret) {
        /* error */
        return NULL;
    }

    /* check that name and revision match filename */
    filename = strrchr(path, '/');
    if (!filename) {
        filename = path;
    } else {
        filename++;
    }
    rev = strchr(filename, '@');
    dot = strrchr(filename, '.');

    /* name */
    len = strlen(ret->name);
    if (strncmp(filename, ret->name, len) ||
            ((rev && rev != &filename[len]) || (!rev && dot != &filename[len]))) {
        LOGWRN("File name \"%s\" does not match module name \"%s\".", filename, ret->name);
    }
    if (rev) {
        len = dot - ++rev;
        if (!ret->rev_size || len != 10 || strncmp(ret->rev[0].date, rev, len)) {
            LOGWRN("File name \"%s\" does not match module revision \"%s\".", filename,
                   ret->rev_size ? ret->rev[0].date : "none");
        }
    }

    if (!ret->filepath) {
        /* store URI */
        ((struct lys_module *)ret)->filepath = lydict_insert(ctx, path, 0);
    }

    return ret;
}